

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t __thiscall httplib::ClientImpl::create_client_socket(ClientImpl *this,Error *error)

{
  bool bVar1;
  socket_t sVar2;
  ulong uVar3;
  pointer ppVar4;
  time_t unaff_RBX;
  time_t in_RSI;
  long in_RDI;
  time_t unaff_R12;
  string *unaff_R14;
  Error *unaff_R15;
  const_iterator it;
  string ip;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe88;
  function<void_(int)> *in_stack_fffffffffffffe98;
  function<void_(int)> *in_stack_fffffffffffffea0;
  _Self local_b8;
  _Self local_b0;
  string local_a8 [56];
  SocketOptions *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff9f;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  time_t in_stack_ffffffffffffffc0;
  long read_timeout_sec;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  read_timeout_sec = in_RDI;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (*(int *)(in_RDI + 0x2b0) != -1)) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffffa8);
    std::function<void_(int)>::function(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    sVar2 = detail::create_client_socket
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4
                       ,in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f,
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffffc0,in_RSI,read_timeout_sec,
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),unaff_RBX,
                       unaff_R12,unaff_R14,unaff_R15);
    std::function<void_(int)>::~function((function<void_(int)> *)0x1e347f);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  else {
    std::__cxx11::string::string(local_a8);
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(in_stack_fffffffffffffe88,(key_type *)0x1e3502);
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_fffffffffffffe88);
    bVar1 = std::operator!=(&local_b0,&local_b8);
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x1e355a);
      std::__cxx11::string::operator=(local_a8,(string *)&ppVar4->second);
    }
    std::function<void_(int)>::function(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    sVar2 = detail::create_client_socket
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4
                       ,in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f,
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffffc0,in_RSI,read_timeout_sec,
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),unaff_RBX,
                       unaff_R12,unaff_R14,unaff_R15);
    std::function<void_(int)>::~function((function<void_(int)> *)0x1e3684);
    std::__cxx11::string::~string(local_a8);
  }
  return sVar2;
}

Assistant:

inline socket_t ClientImpl::create_client_socket(Error& error) const {
        if (!proxy_host_.empty() && proxy_port_ != -1) {
            return detail::create_client_socket(
                proxy_host_, std::string(), proxy_port_, address_family_, tcp_nodelay_,
                socket_options_, connection_timeout_sec_, connection_timeout_usec_,
                read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
                write_timeout_usec_, interface_, error);
        }

        // Check is custom IP specified for host_
        std::string ip;
        auto it = addr_map_.find(host_);
        if (it != addr_map_.end()) ip = it->second;

        return detail::create_client_socket(
            host_, ip, port_, address_family_, tcp_nodelay_, socket_options_,
            connection_timeout_sec_, connection_timeout_usec_, read_timeout_sec_,
            read_timeout_usec_, write_timeout_sec_, write_timeout_usec_, interface_,
            error);
    }